

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

void CSOAA::do_actual_learning<false>(ldf *data,single_learner *base,multi_ex *ec_seq_all)

{
  value_type peVar1;
  double dVar2;
  action_score *paVar3;
  bool bVar4;
  size_type sVar5;
  reference ppeVar6;
  undefined8 uVar7;
  action_score **ppaVar8;
  size_t sVar9;
  v_array<ACTION_SCORE::action_score> *pvVar10;
  wclass *pwVar11;
  reference ppeVar12;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  long in_RDI;
  float fVar13;
  example **example_1;
  iterator __end3_1;
  iterator __begin3_1;
  multi_ex *__range3_1;
  float prob;
  example **example;
  iterator __end3;
  iterator __begin3;
  multi_ex *__range3;
  float sum_prob;
  size_t k_3;
  size_t k_2;
  example *ec_1;
  uint32_t k_1;
  float min_score;
  action_score s;
  example *ec;
  uint32_t k;
  uint32_t predicted_K;
  bool isTest;
  uint32_t K;
  stringstream __msg;
  multi_ex ec_seq;
  v_array<ACTION_SCORE::action_score> *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  float in_stack_fffffffffffffd34;
  vector<example_*,_std::allocator<example_*>_> *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd50;
  int plineNumber;
  action_score *paVar14;
  char *in_stack_fffffffffffffd58;
  vector<example_*,_std::allocator<example_*>_> *this;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  example *in_stack_fffffffffffffd80;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
  in_stack_fffffffffffffd88;
  ldf *in_stack_fffffffffffffd90;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_250;
  vector<example_*,_std::allocator<example_*>_> *local_248;
  float local_23c;
  ulong local_238;
  ulong local_230;
  value_type local_228;
  uint local_220;
  float local_21c;
  uint local_218;
  float local_214;
  value_type local_210;
  uint local_204;
  uint local_200;
  undefined1 local_1f9;
  uint local_1f8;
  undefined1 local_1f1;
  stringstream local_1d0 [16];
  ostream local_1c0;
  undefined4 local_34;
  vector<example_*,_std::allocator<example_*>_> local_30;
  vector<example_*,_std::allocator<example_*>_> *local_18;
  long local_8;
  
  plineNumber = (int)((ulong)in_stack_fffffffffffffd50 >> 0x20);
  local_18 = in_RDX;
  local_8 = in_RDI;
  sVar5 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RDX);
  if (sVar5 != 0) {
    ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0);
    *(uint64_t *)(local_8 + 0xf0) = ((*ppeVar6)->super_example_predict).ft_offset;
    process_labels((ldf *)in_stack_fffffffffffffd88._M_current,(multi_ex *)in_stack_fffffffffffffd80
                  );
    sVar5 = std::vector<example_*,_std::allocator<example_*>_>::size(&local_30);
    if (sVar5 == 0) {
      local_34 = 1;
    }
    else {
      bVar4 = ec_seq_has_label_definition(in_stack_fffffffffffffd40);
      if (bVar4) {
        std::__cxx11::stringstream::stringstream(local_1d0);
        std::operator<<(&local_1c0,"error: label definition encountered in data block");
        local_1f1 = 1;
        uVar7 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  ((vw_exception *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                   in_stack_fffffffffffffd58,plineNumber,in_stack_fffffffffffffd48);
        local_1f1 = 0;
        __cxa_throw(uVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      this = &local_30;
      sVar5 = std::vector<example_*,_std::allocator<example_*>_>::size(this);
      local_1f8 = (uint)sVar5;
      local_1f9 = test_ldf_sequence((ldf *)CONCAT17(in_stack_fffffffffffffd67,
                                                    in_stack_fffffffffffffd60),this);
      local_200 = 0;
      if ((*(byte *)(local_8 + 200) & 1) == 0) {
        local_21c = 3.4028235e+38;
        for (local_220 = 0; local_220 < local_1f8; local_220 = local_220 + 1) {
          ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              (&local_30,(ulong)local_220);
          local_228 = *ppeVar6;
          make_single_prediction
                    (in_stack_fffffffffffffd90,
                     (single_learner *)in_stack_fffffffffffffd88._M_current,
                     in_stack_fffffffffffffd80);
          if (local_228->partial_prediction < local_21c) {
            local_21c = local_228->partial_prediction;
            local_200 = local_220;
          }
        }
      }
      else {
        v_array<ACTION_SCORE::action_score>::clear
                  ((v_array<ACTION_SCORE::action_score> *)
                   CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
        v_array<v_array<ACTION_SCORE::action_score>_>::clear
                  ((v_array<v_array<ACTION_SCORE::action_score>_> *)
                   CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
        for (local_204 = 0; local_204 < local_1f8; local_204 = local_204 + 1) {
          ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              (&local_30,(ulong)local_204);
          local_210 = *ppeVar6;
          v_array<v_array<ACTION_SCORE::action_score>_>::push_back
                    ((v_array<v_array<ACTION_SCORE::action_score>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                     in_stack_fffffffffffffd28);
          make_single_prediction
                    (in_stack_fffffffffffffd90,
                     (single_learner *)in_stack_fffffffffffffd88._M_current,
                     in_stack_fffffffffffffd80);
          local_214 = local_210->partial_prediction;
          local_218 = local_204;
          v_array<ACTION_SCORE::action_score>::push_back
                    ((v_array<ACTION_SCORE::action_score> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                     (action_score *)in_stack_fffffffffffffd28);
        }
        ppaVar8 = v_array<ACTION_SCORE::action_score>::begin
                            ((v_array<ACTION_SCORE::action_score> *)(local_8 + 0xd0));
        paVar14 = *ppaVar8;
        sVar9 = v_array<ACTION_SCORE::action_score>::size
                          ((v_array<ACTION_SCORE::action_score> *)(local_8 + 0xd0));
        qsort(paVar14,sVar9,8,ACTION_SCORE::score_comp);
      }
      if ((*(byte *)(local_8 + 200) & 1) == 0) {
        for (local_238 = 0; local_238 < local_1f8; local_238 = local_238 + 1) {
          if (local_238 == local_200) {
            ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                                (&local_30,local_238);
            pwVar11 = v_array<COST_SENSITIVE::wclass>::operator[]
                                ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar6)->l).simple,0);
            in_stack_fffffffffffffd34 = (float)pwVar11->class_index;
            ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                                (&local_30,local_238);
            ((*ppeVar6)->pred).scalar = in_stack_fffffffffffffd34;
          }
          else {
            ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                                (&local_30,local_238);
            ((*ppeVar6)->pred).scalar = 0.0;
          }
        }
      }
      else {
        v_array<v_array<ACTION_SCORE::action_score>_>::operator[]
                  ((v_array<v_array<ACTION_SCORE::action_score>_> *)(local_8 + 0xf8),0);
        v_array<ACTION_SCORE::action_score>::clear
                  ((v_array<ACTION_SCORE::action_score> *)
                   CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
        for (local_230 = 0; local_230 < local_1f8; local_230 = local_230 + 1) {
          pvVar10 = v_array<v_array<ACTION_SCORE::action_score>_>::operator[]
                              ((v_array<v_array<ACTION_SCORE::action_score>_> *)(local_8 + 0xf8),
                               local_230);
          in_stack_fffffffffffffd40 = &local_30;
          ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              (in_stack_fffffffffffffd40,local_230);
          peVar1 = *ppeVar6;
          paVar14 = pvVar10->_begin;
          paVar3 = pvVar10->_end;
          sVar9 = pvVar10->erase_count;
          (peVar1->pred).scalars.end_array = (float *)pvVar10->end_array;
          (peVar1->pred).scalars.erase_count = sVar9;
          (peVar1->pred).scalars._begin = (float *)paVar14;
          (peVar1->pred).scalars._end = (float *)paVar3;
          std::vector<example_*,_std::allocator<example_*>_>::operator[]
                    (in_stack_fffffffffffffd40,0);
          v_array<ACTION_SCORE::action_score>::operator[]
                    ((v_array<ACTION_SCORE::action_score> *)(local_8 + 0xd0),local_230);
          v_array<ACTION_SCORE::action_score>::push_back
                    ((v_array<ACTION_SCORE::action_score> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                     (action_score *)in_stack_fffffffffffffd28);
        }
      }
      if ((*(byte *)(local_8 + 0xbb) & 1) != 0) {
        local_23c = 0.0;
        local_248 = &local_30;
        local_250._M_current =
             (example **)
             std::vector<example_*,_std::allocator<example_*>_>::begin
                       ((vector<example_*,_std::allocator<example_*>_> *)in_stack_fffffffffffffd28);
        std::vector<example_*,_std::allocator<example_*>_>::end
                  ((vector<example_*,_std::allocator<example_*>_> *)in_stack_fffffffffffffd28);
        while (bVar4 = __gnu_cxx::operator!=
                                 ((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                  (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                                   *)in_stack_fffffffffffffd28), bVar4) {
          ppeVar12 = __gnu_cxx::
                     __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                     ::operator*(&local_250);
          dVar2 = std::exp((double)(ulong)(uint)(*ppeVar12)->partial_prediction);
          fVar13 = 1.0 / (SUB84(dVar2,0) + 1.0);
          ((*ppeVar12)->pred).scalar = fVar13;
          local_23c = fVar13 + local_23c;
          __gnu_cxx::
          __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
          operator++(&local_250);
        }
        std::vector<example_*,_std::allocator<example_*>_>::begin
                  ((vector<example_*,_std::allocator<example_*>_> *)in_stack_fffffffffffffd28);
        std::vector<example_*,_std::allocator<example_*>_>::end
                  ((vector<example_*,_std::allocator<example_*>_> *)in_stack_fffffffffffffd28);
        while (bVar4 = __gnu_cxx::operator!=
                                 ((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                  (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                                   *)in_stack_fffffffffffffd28), bVar4) {
          ppeVar12 = __gnu_cxx::
                     __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                     ::operator*((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                                  *)&stack0xfffffffffffffd88);
          ((*ppeVar12)->pred).scalar = ((*ppeVar12)->pred).scalar / local_23c;
          __gnu_cxx::
          __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
          operator++((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                      *)&stack0xfffffffffffffd88);
        }
      }
      local_34 = 0;
    }
    std::vector<example_*,_std::allocator<example_*>_>::~vector(in_stack_fffffffffffffd40);
  }
  return;
}

Assistant:

void do_actual_learning(ldf& data, single_learner& base, multi_ex& ec_seq_all)
{
  if (ec_seq_all.size() == 0)
    return;  // nothing to do

  data.ft_offset = ec_seq_all[0]->ft_offset;

  // handle label definitions
  auto ec_seq = process_labels(data, ec_seq_all);
  if (ec_seq.size() == 0)
    return;  // nothing more to do

  // Ensure there are no more labels
  // (can be done in existing loops later but as a side effect learning
  //    will happen with bad example)
  if (ec_seq_has_label_definition(ec_seq))
  {
    THROW("error: label definition encountered in data block");
  }

  /////////////////////// add headers
  uint32_t K = (uint32_t)ec_seq.size();

  bool isTest = test_ldf_sequence(data, ec_seq);
  /////////////////////// do prediction
  uint32_t predicted_K = 0;
  if (data.rank)
  {
    data.a_s.clear();
    data.stored_preds.clear();
    for (uint32_t k = 0; k < K; k++)
    {
      example* ec = ec_seq[k];
      data.stored_preds.push_back(ec->pred.a_s);
      make_single_prediction(data, base, *ec);
      action_score s;
      s.score = ec->partial_prediction;
      s.action = k;
      data.a_s.push_back(s);
    }

    qsort((void*)data.a_s.begin(), data.a_s.size(), sizeof(action_score), score_comp);
  }
  else
  {
    float min_score = FLT_MAX;
    for (uint32_t k = 0; k < K; k++)
    {
      example* ec = ec_seq[k];
      make_single_prediction(data, base, *ec);
      if (ec->partial_prediction < min_score)
      {
        min_score = ec->partial_prediction;
        predicted_K = k;
      }
    }
  }

  /////////////////////// learn
  if (is_learn && !isTest)
  {
    if (data.is_wap)
      do_actual_learning_wap(data, base, ec_seq);
    else
      do_actual_learning_oaa(data, base, ec_seq);
  }

  if (data.rank)
  {
    data.stored_preds[0].clear();
    for (size_t k = 0; k < K; k++)
    {
      ec_seq[k]->pred.a_s = data.stored_preds[k];
      ec_seq[0]->pred.a_s.push_back(data.a_s[k]);
    }
  }
  else
  {
    // Mark the predicted subexample with its class_index, all other with 0
    for (size_t k = 0; k < K; k++)
    {
      if (k == predicted_K)
        ec_seq[k]->pred.multiclass = ec_seq[k]->l.cs.costs[0].class_index;
      else
        ec_seq[k]->pred.multiclass = 0;
    }
  }

  ////////////////////// compute probabilities
  if (data.is_probabilities)
  {
    float sum_prob = 0;
    for (const auto & example : ec_seq)
    {
      // probability(correct_class) = 1 / (1+exp(-score)), where score is higher for better classes,
      // but partial_prediction is lower for better classes (we are predicting the cost),
      // so we need to take score = -partial_prediction,
      // thus probability(correct_class) = 1 / (1+exp(-(-partial_prediction)))
      float prob = 1.f / (1.f + correctedExp(example->partial_prediction));
      example->pred.prob = prob;
      sum_prob += prob;
    }
    // make sure that the probabilities sum up (exactly) to one
    for (const auto& example : ec_seq)
    {
      example->pred.prob /= sum_prob;
    }
  }
}